

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O3

void __thiscall cmCTestMultiProcessHandler::RunTests(cmCTestMultiProcessHandler *this)

{
  uv_loop_t *loop;
  cmCTestTestHandler *pcVar1;
  _Rb_tree_node_base *p_Var2;
  _Rb_tree_color _Var3;
  
  CheckResume(this);
  if (this->HasCycles != false) {
    return;
  }
  pcVar1 = this->TestHandler;
  _Var3 = _S_red;
  for (p_Var2 = (this->Tests).
                super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 !=
      &(this->Tests).
       super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
       ._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    if ((int)_Var3 < (int)p_Var2[1]._M_color) {
      _Var3 = p_Var2[1]._M_color;
    }
  }
  pcVar1->MaxIndex = _Var3;
  loop = &this->Loop;
  uv_loop_init(loop);
  StartNextTests(this);
  uv_run(loop,UV_RUN_DEFAULT);
  uv_loop_close(loop);
  MarkFinished(this);
  UpdateCostData(this);
  return;
}

Assistant:

void cmCTestMultiProcessHandler::RunTests()
{
  this->CheckResume();
  if (this->HasCycles) {
    return;
  }
#ifdef CMAKE_UV_SIGNAL_HACK
  cmUVSignalHackRAII hackRAII;
#endif
  this->TestHandler->SetMaxIndex(this->FindMaxIndex());

  uv_loop_init(&this->Loop);
  this->StartNextTests();
  uv_run(&this->Loop, UV_RUN_DEFAULT);
  uv_loop_close(&this->Loop);

  this->MarkFinished();
  this->UpdateCostData();
}